

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform.cpp
# Opt level: O0

Transform * pbrt::RotateZ(Float theta)

{
  Transform *in_RDI;
  Float in_XMM0_Da;
  int args_13;
  double dVar1;
  undefined1 auVar2 [64];
  undefined1 auVar3 [64];
  int unaff_retaddr;
  SquareMatrix<4> m;
  Float cosTheta;
  Float sinTheta;
  undefined4 uVar4;
  undefined4 in_stack_ffffffffffffff34;
  undefined4 uVar5;
  undefined4 in_stack_ffffffffffffff3c;
  undefined4 uVar6;
  undefined4 in_stack_ffffffffffffff44;
  Transform *pTVar7;
  int in_stack_ffffffffffffff70;
  int in_stack_ffffffffffffff74;
  float in_stack_ffffffffffffff78;
  float in_stack_ffffffffffffff7c;
  int in_stack_ffffffffffffff80;
  int in_stack_ffffffffffffff84;
  float in_stack_ffffffffffffff88;
  Float in_stack_ffffffffffffff8c;
  SquareMatrix<4> *in_stack_ffffffffffffff90;
  int in_stack_ffffffffffffffd0;
  int in_stack_ffffffffffffffd8;
  int in_stack_ffffffffffffffe0;
  int in_stack_ffffffffffffffe8;
  int in_stack_fffffffffffffff0;
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  
  pTVar7 = in_RDI;
  auVar2._0_4_ = Radians(in_XMM0_Da);
  auVar2._4_60_ = extraout_var;
  dVar1 = std::sin(auVar2._0_8_);
  args_13 = SUB84(dVar1,0);
  auVar3._0_4_ = Radians(in_XMM0_Da);
  auVar3._4_60_ = extraout_var_00;
  std::cos(auVar3._0_8_);
  uVar4 = 1;
  uVar5 = 0;
  uVar6 = 0;
  SquareMatrix<4>::SquareMatrix<float,int,int,float,float,int,int,int,int,int,int,int,int,int,int>
            (in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88,
             in_stack_ffffffffffffff84,in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c,
             in_stack_ffffffffffffff78,in_stack_ffffffffffffff74,in_stack_ffffffffffffff70,
             (int)((ulong)pTVar7 >> 0x20),in_stack_ffffffffffffffd0,in_stack_ffffffffffffffd8,
             in_stack_ffffffffffffffe0,in_stack_ffffffffffffffe8,in_stack_fffffffffffffff0,args_13,
             unaff_retaddr);
  Transpose<4>(&in_RDI->m);
  Transform::Transform
            ((Transform *)CONCAT44(in_stack_ffffffffffffff44,uVar6),
             (SquareMatrix<4> *)CONCAT44(in_stack_ffffffffffffff3c,uVar5),
             (SquareMatrix<4> *)CONCAT44(in_stack_ffffffffffffff34,uVar4));
  return pTVar7;
}

Assistant:

PBRT_CPU_GPU Transform RotateZ(Float theta) {
    Float sinTheta = std::sin(Radians(theta));
    Float cosTheta = std::cos(Radians(theta));
    SquareMatrix<4> m(cosTheta, -sinTheta, 0, 0,
                      sinTheta,  cosTheta, 0, 0,
                             0,         0, 1, 0,
                             0,         0, 0, 1);
    return Transform(m, Transpose(m));
}